

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O1

void jpeg_fdct_2x4(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  uint uVar22;
  int iVar8;
  undefined1 auVar7 [16];
  int iVar10;
  uint uVar23;
  int iVar12;
  undefined1 auVar11 [16];
  int iVar13;
  int iVar16;
  ulong uVar15;
  ulong uVar17;
  long lVar18;
  int iVar19;
  int iVar21;
  ulong uVar9;
  int iVar14;
  int iVar20;
  
  lVar5 = 0;
  memset(data,0,0x100);
  do {
    bVar1 = *(byte *)(*(long *)((long)sample_data + lVar5) + (ulong)start_col);
    bVar2 = *(byte *)(*(long *)((long)sample_data + lVar5) + 1 + (ulong)start_col);
    data[lVar5] = ((uint)bVar2 + (uint)bVar1) * 8 + -0x800;
    data[lVar5 + 1] = ((uint)bVar1 - (uint)bVar2) * 8;
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x20);
  iVar10 = (int)*(undefined8 *)data;
  iVar14 = (int)*(undefined8 *)(data + 0x18);
  iVar3 = (int)((ulong)*(undefined8 *)(data + 0x18) >> 0x20);
  iVar13 = iVar14 + iVar10;
  iVar12 = (int)((ulong)*(undefined8 *)data >> 0x20);
  iVar16 = iVar3 + iVar12;
  iVar6 = (int)*(undefined8 *)(data + 8);
  iVar20 = (int)*(undefined8 *)(data + 0x10);
  iVar4 = (int)((ulong)*(undefined8 *)(data + 0x10) >> 0x20);
  iVar19 = iVar20 + iVar6;
  iVar8 = (int)((ulong)*(undefined8 *)(data + 8) >> 0x20);
  iVar21 = iVar4 + iVar8;
  uVar23 = iVar10 - iVar14;
  auVar11._4_4_ = iVar12 - iVar3;
  auVar11._8_4_ = auVar11._4_4_;
  auVar11._12_4_ = -(uint)(auVar11._4_4_ < 0);
  uVar22 = iVar6 - iVar20;
  auVar7._4_4_ = iVar8 - iVar4;
  auVar7._8_4_ = auVar7._4_4_;
  auVar7._12_4_ = -(uint)(auVar7._4_4_ < 0);
  uVar9 = auVar7._8_8_;
  *(ulong *)data = CONCAT44(iVar21 + iVar16,iVar19 + iVar13);
  *(ulong *)(data + 0x10) = CONCAT44(iVar16 - iVar21,iVar13 - iVar19);
  uVar15 = CONCAT44(-(uint)((int)uVar22 < 0),uVar22) + CONCAT44(-(uint)((int)uVar23 < 0),uVar23);
  uVar17 = uVar9 + auVar11._8_8_;
  lVar5 = ((uVar15 >> 0x20) * 0x1151 << 0x20) + (uVar15 & 0xffffffff) * 0x1151 + 0x1000;
  lVar18 = ((uVar17 >> 0x20) * 0x1151 << 0x20) + (uVar17 & 0xffffffff) * 0x1151 + 0x1000;
  *(ulong *)(data + 8) =
       CONCAT44((int)(((ulong)-(uint)(auVar11._4_4_ < 0) * 0x187e << 0x20) +
                      (auVar11._8_8_ & 0xffffffff) * 0x187e + lVar18 >> 0xd),
                (int)(((ulong)-(uint)((int)uVar23 < 0) * 0x187e << 0x20) + (ulong)uVar23 * 0x187e +
                      lVar5 >> 0xd));
  *(ulong *)(data + 0x18) =
       CONCAT44((int)(((ulong)-(uint)(auVar7._4_4_ < 0) * 0xffffc4df + (uVar9 & 0xffffffff) * 0x1fff
                      << 0x20) + (uVar9 & 0xffffffff) * 0xffffc4df + lVar18 >> 0xd),
                (int)(((ulong)-(uint)((int)uVar22 < 0) * 0xffffc4df + (ulong)uVar22 * 0x1fff << 0x20
                      ) + (ulong)uVar22 * 0xffffc4df + lVar5 >> 0xd));
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_2x4 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1;
  INT32 tmp10, tmp11;
  DCTELEM *dataptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pre-zero output coefficient block. */
  MEMZERO(data, SIZEOF(DCTELEM) * DCTSIZE2);

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT. */
  /* We must also scale the output by (8/2)*(8/4) = 2**3, which we add here. */

  dataptr = data;
  for (ctr = 0; ctr < 4; ctr++) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]);
    tmp1 = GETJSAMPLE(elemptr[1]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM) ((tmp0 + tmp1 - 2 * CENTERJSAMPLE) << 3);

    /* Odd part */

    dataptr[1] = (DCTELEM) ((tmp0 - tmp1) << 3);

    dataptr += DCTSIZE;		/* advance pointer to next row */
  }

  /* Pass 2: process columns.
   * We leave the results scaled up by an overall factor of 8.
   * 4-point FDCT kernel,
   * cK represents sqrt(2) * cos(K*pi/16) [refers to 8-point FDCT].
   */

  dataptr = data;
  for (ctr = 0; ctr < 2; ctr++) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + dataptr[DCTSIZE*3];
    tmp1 = dataptr[DCTSIZE*1] + dataptr[DCTSIZE*2];

    tmp10 = dataptr[DCTSIZE*0] - dataptr[DCTSIZE*3];
    tmp11 = dataptr[DCTSIZE*1] - dataptr[DCTSIZE*2];

    dataptr[DCTSIZE*0] = (DCTELEM) (tmp0 + tmp1);
    dataptr[DCTSIZE*2] = (DCTELEM) (tmp0 - tmp1);

    /* Odd part */

    tmp0 = MULTIPLY(tmp10 + tmp11, FIX_0_541196100);       /* c6 */
    /* Add fudge factor here for final descale. */
    tmp0 += ONE << (CONST_BITS-1);

    dataptr[DCTSIZE*1] = (DCTELEM)
      RIGHT_SHIFT(tmp0 + MULTIPLY(tmp10, FIX_0_765366865), /* c2-c6 */
		  CONST_BITS);
    dataptr[DCTSIZE*3] = (DCTELEM)
      RIGHT_SHIFT(tmp0 - MULTIPLY(tmp11, FIX_1_847759065), /* c2+c6 */
		  CONST_BITS);

    dataptr++;			/* advance pointer to next column */
  }
}